

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict
utf16_2_str(sexp_conflict ctx,char *bv,int len,sexp_conflict endianness,int endianness_mandatory)

{
  ushort uVar1;
  int iVar2;
  sexp_conflict psVar3;
  long in_RCX;
  int in_EDX;
  short *in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar4;
  uchar *dst;
  sexp_conflict res;
  sexp_sint_t start;
  sexp_sint_t utf8_len;
  sexp_sint_t ch_len;
  sexp_sint_t i;
  uint16_t ch2;
  uint16_t ch;
  int swap;
  ushort local_74;
  uchar *local_68;
  long local_58;
  long local_50;
  long local_40;
  ushort local_32;
  
  bVar4 = in_RCX != *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
  local_50 = 0;
  local_58 = 0;
  if ((in_R8D == 0) && (1 < in_EDX)) {
    if (*in_RSI == -2) {
      bVar4 = true;
      local_58 = 2;
    }
    else if (*in_RSI == -0x101) {
      local_58 = 2;
    }
  }
  for (local_40 = local_58; local_40 + 1 < (long)in_EDX; local_40 = local_40 + 2) {
    if (bVar4) {
      local_32 = sexp_swap_u16(*(uint16_t *)((long)in_RSI + local_40));
    }
    else {
      local_32 = *(ushort *)((long)in_RSI + local_40);
    }
    if (((0xd7ff < local_32) && (local_32 < 0xdc00)) && (local_40 + 3 < (long)in_EDX)) {
      if (bVar4) {
        uVar1 = sexp_swap_u16(*(uint16_t *)((long)in_RSI + local_40 + 2));
      }
      else {
        uVar1 = *(ushort *)((long)in_RSI + local_40 + 2);
      }
      if ((0xdbff < uVar1) && (uVar1 < 0xe000)) {
        local_32 = local_32 * 0x400 | uVar1 + 0x2400;
        local_40 = local_40 + 2;
      }
    }
    iVar2 = utf8_char_byte_count((uint)local_32);
    local_50 = iVar2 + local_50;
  }
  psVar3 = (sexp_conflict)sexp_make_string_op(in_RDI,0,2,local_50 << 1 | 1,0x43e);
  if (((psVar3 != (sexp_conflict)0x0) && (((ulong)psVar3 & 3) == 0)) && (psVar3->tag == 9)) {
    local_68 = &(((psVar3->value).type.name)->value).uvector.element_type +
               (long)(psVar3->value).type.cpl;
    for (local_40 = local_58; local_40 + 1 < (long)in_EDX; local_40 = local_40 + 2) {
      if (bVar4) {
        local_74 = sexp_swap_u16(*(uint16_t *)((long)in_RSI + local_40));
      }
      else {
        local_74 = *(ushort *)((long)in_RSI + local_40);
      }
      local_32 = local_74;
      if (((0xd7ff < local_74) && (local_74 < 0xdc00)) && (local_40 + 3 < (long)in_EDX)) {
        if (bVar4) {
          uVar1 = sexp_swap_u16(*(uint16_t *)((long)in_RSI + local_40 + 2));
        }
        else {
          uVar1 = *(ushort *)((long)in_RSI + local_40 + 2);
        }
        if ((0xdbff < uVar1) && (uVar1 < 0xe000)) {
          local_32 = local_74 * 0x400 | uVar1 + 0x2400;
          local_40 = local_40 + 2;
        }
      }
      iVar2 = utf8_char_byte_count((uint)local_32);
      utf8_encode_char(local_68,iVar2,(uint)local_32);
      local_68 = local_68 + iVar2;
    }
  }
  return psVar3;
}

Assistant:

sexp utf16_2_str(sexp ctx, char* bv, int len, sexp endianness, int endianness_mandatory) {
  int swap = endianness != sexp_global(ctx, SEXP_G_ENDIANNESS);
  uint16_t ch, ch2;
  sexp_sint_t i, ch_len, utf8_len=0, start=0;
  sexp res;
  unsigned char* dst;
  if (!endianness_mandatory && len>1) {
    ch = *(uint16_t*)(bv);
    if (ch == 0xFFFE) {
      swap = 1;
      start = 2;
    } else if (ch == 0xFEFF) {
      start = 2;
    }
  }
  for (i=start; i+1<len; i+=2) {
    ch = swap ? sexp_swap_u16(*((uint16_t*)(bv+i))) : *((uint16_t*)(bv+i));
    if (0xd800 <= ch && ch <= 0xdbff && i+3<len) {
      ch2 = swap ? sexp_swap_u16(*((uint16_t*)(bv+i+2))) : *((uint16_t*)(bv+i+2));
      if (0xdc00 <= ch2 && ch2 <= 0xdfff) {
        ch = 0x10000 + (((ch - 0xd800) << 10) | (ch2 - 0xdc00));
        i += 2;
      }
    }
    utf8_len += utf8_char_byte_count(ch);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(utf8_len), SEXP_VOID);
  if (!(res && sexp_stringp(res))) return res;
  dst = (unsigned char*) sexp_string_data(res);
  for (i=start; i+1<len; i+=2) {
    ch = swap ? sexp_swap_u16(*((uint16_t*)(bv+i))) : *((uint16_t*)(bv+i));
    if (0xd800 <= ch && ch <= 0xdbff && i+3<len) {
      ch2 = swap ? sexp_swap_u16(*((uint16_t*)(bv+i+2))) : *((uint16_t*)(bv+i+2));
      if (0xdc00 <= ch2 && ch2 <= 0xdfff) {
        ch = 0x10000 + (((ch - 0xd800) << 10) | (ch2 - 0xdc00));
        i += 2;
      }
    }
    ch_len = utf8_char_byte_count(ch);
    utf8_encode_char(dst, ch_len, ch);
    dst += ch_len;
  }
  return res;
}